

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_SearchMultipleDirectories_Test::
~DiskSourceTreeTest_SearchMultipleDirectories_Test
          (DiskSourceTreeTest_SearchMultipleDirectories_Test *this)

{
  DiskSourceTreeTest_SearchMultipleDirectories_Test *this_local;
  
  ~DiskSourceTreeTest_SearchMultipleDirectories_Test(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, SearchMultipleDirectories) {
  // Test mapping and searching multiple directories.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddFile(absl::StrCat(dirnames_[1], "/foo"), "This file should be hidden.");
  AddFile(absl::StrCat(dirnames_[1], "/bar"), "Goodbye World!");
  source_tree_.MapPath("", dirnames_[0]);
  source_tree_.MapPath("", dirnames_[1]);

  ExpectFileContents("foo", "Hello World!");
  ExpectFileContents("bar", "Goodbye World!");
  ExpectCannotOpenFile("baz", "File not found.");
}